

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> * __thiscall
cmGeneratorTarget::GetLanguageStandardProperty(cmGeneratorTarget *this,string *lang,string *config)

{
  cmTarget *this_00;
  const_iterator cVar1;
  BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pBVar2;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string key;
  string local_d8;
  string local_b8;
  string local_98;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_60;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  size_type local_30;
  pointer local_28;
  undefined8 local_20;
  
  cmsys::SystemTools::UpperCase(&local_b8,config);
  local_60.first._M_len = local_b8._M_string_length;
  local_60.first._M_str = local_b8._M_dataplus._M_p;
  local_98.field_2._M_allocated_capacity = (long)&local_98.field_2 + 8;
  local_98._M_dataplus._M_p = (pointer)0x0;
  local_98._M_string_length = 1;
  local_98.field_2._M_local_buf[8] = '-';
  local_48 = 1;
  local_38 = 0;
  local_28 = (lang->_M_dataplus)._M_p;
  local_30 = lang->_M_string_length;
  local_20 = 0;
  views._M_len = 3;
  views._M_array = &local_60;
  local_60.second = &local_b8;
  local_40 = (char *)local_98.field_2._M_allocated_capacity;
  cmCatViews(&local_d8,views);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::find(&(this->LanguageStandardMap)._M_t,&local_d8);
  if ((_Rb_tree_header *)cVar1._M_node ==
      &(this->LanguageStandardMap)._M_t._M_impl.super__Rb_tree_header) {
    this_00 = this->Target;
    local_60.first._M_str = (lang->_M_dataplus)._M_p;
    local_60.first._M_len = lang->_M_string_length;
    local_60.second = (string *)0x0;
    local_48 = 9;
    local_40 = "_STANDARD";
    local_38 = 0;
    views_00._M_len = 2;
    views_00._M_array = &local_60;
    cmCatViews(&local_98,views_00);
    pBVar2 = cmTarget::GetLanguageStandardProperty(this_00,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,(ulong)(local_98.field_2._M_allocated_capacity + 1))
      ;
    }
  }
  else {
    pBVar2 = (BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(cVar1._M_node + 2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  return pBVar2;
}

Assistant:

BTs<std::string> const* cmGeneratorTarget::GetLanguageStandardProperty(
  std::string const& lang, std::string const& config) const
{
  std::string key = cmStrCat(cmSystemTools::UpperCase(config), '-', lang);
  auto langStandardIter = this->LanguageStandardMap.find(key);
  if (langStandardIter != this->LanguageStandardMap.end()) {
    return &langStandardIter->second;
  }

  return this->Target->GetLanguageStandardProperty(
    cmStrCat(lang, "_STANDARD"));
}